

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::BroadcastCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  bool bVar1;
  JsErrorCode JVar2;
  RuntimeThreadLocalData *pRVar3;
  size_type sVar4;
  HANDLE pVVar5;
  reference ppRVar6;
  PAL_FILE *pPVar7;
  RuntimeThreadData *child;
  _Self local_60;
  iterator i;
  LONG count;
  RuntimeThreadData **threadData;
  JsValueRef pvStack_40;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_30;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_20;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_10;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0x80004005;
  pvStack_40 = (JsValueRef)0x0;
  pvStack_30 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_20 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_10 = callee;
  JVar2 = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffc0);
  if (((JVar2 == JsNoError) && (1 < callbackState_local._6_2_)) &&
     (pRVar3 = GetRuntimeThreadLocalData(), pRVar3->threadData != (RuntimeThreadData *)0x0)) {
    ChakraRTInterface::JsGetSharedArrayBufferContent
              (ppvStack_20[1],&pRVar3->threadData->sharedContent);
    sVar4 = std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::size
                      (&pRVar3->threadData->children);
    i._M_node._4_4_ = (LONG)sVar4;
    pVVar5 = CreateSemaphoreW((LPSECURITY_ATTRIBUTES)0x0,0,i._M_node._4_4_,(LPCWSTR)0x0);
    pRVar3->threadData->hSemaphore = pVVar5;
    if (pRVar3->threadData->hSemaphore == (HANDLE)0x0) {
      pPVar7 = PAL_get_stderr(0);
      PAL_fwprintf(pPVar7,L"Couldn\'t create semaphore.\n");
      pPVar7 = PAL_get_stderr(0);
      PAL_fflush(pPVar7);
    }
    else {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::begin
                     (&pRVar3->threadData->children);
      while( true ) {
        child = (RuntimeThreadData *)
                std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::end
                          (&pRVar3->threadData->children);
        bVar1 = std::operator!=(&local_60,(_Self *)&child);
        if (!bVar1) break;
        ppRVar6 = std::_List_iterator<RuntimeThreadData_*>::operator*(&local_60);
        SetEvent((*ppRVar6)->hevntReceivedBroadcast);
        std::_List_iterator<RuntimeThreadData_*>::operator++(&local_60,0);
      }
      WaitForSingleObject(pRVar3->threadData->hSemaphore,0xffffffff);
      CloseHandle(pRVar3->threadData->hSemaphore);
      pRVar3->threadData->hSemaphore = &DAT_ffffffffffffffff;
    }
    ChakraRTInterface::JsReleaseSharedArrayBufferContentHandle(pRVar3->threadData->sharedContent);
  }
  return pvStack_40;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::BroadcastCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            ChakraRTInterface::JsGetSharedArrayBufferContent(arguments[1], &threadData->sharedContent);

            LONG count = (LONG)threadData->children.size();
            threadData->hSemaphore = CreateSemaphore(NULL, 0, count, NULL);
            if (threadData->hSemaphore)
            {
                //Clang does not support "for each" yet
                for (auto i = threadData->children.begin(); i != threadData->children.end(); i++)
                {
                    auto child = *i;
                    SetEvent(child->hevntReceivedBroadcast);
                }

                WaitForSingleObject(threadData->hSemaphore, INFINITE);
                CloseHandle(threadData->hSemaphore);
                threadData->hSemaphore = INVALID_HANDLE_VALUE;
            }
            else
            {
                fwprintf(stderr, _u("Couldn't create semaphore.\n"));
                fflush(stderr);
            }

            ChakraRTInterface::JsReleaseSharedArrayBufferContentHandle(threadData->sharedContent);
        }
    }

Error:
    return returnValue;
}